

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O2

application_protocol * init_app_proto(char *proto)

{
  uint __line;
  int iVar1;
  int iVar2;
  application_protocol *app_proto;
  undefined8 *puVar3;
  char *pcVar4;
  void *__s;
  code *pcVar5;
  rand_gen *prVar6;
  size_t __size;
  double dVar7;
  char hostname [64];
  
  app_proto = (application_protocol *)malloc(0x20);
  if (app_proto == (application_protocol *)0x0) {
    __assert_fail("app_proto",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                  ,0x10a,"struct application_protocol *init_app_proto(char *)");
  }
  memset(random_char,0x78,0x200000);
  iVar1 = strncmp(proto,"echo",4);
  if (iVar1 != 0) {
    iVar1 = strncmp(proto,"synthetic",9);
    if (iVar1 != 0) {
      iVar1 = strncmp(proto,"redis",5);
      if (iVar1 == 0) {
        redis_init(proto,app_proto);
        return app_proto;
      }
      iVar1 = strncmp(proto,"memcache",8);
      if (iVar1 == 0) {
        memcache_init(proto,app_proto);
        return app_proto;
      }
      iVar1 = strncmp(proto,"http",4);
      if (iVar1 == 0) {
        iVar1 = http_proto_init(proto,app_proto);
        if (iVar1 == 0) {
          return app_proto;
        }
        return (application_protocol *)0x0;
      }
      iVar1 = strncmp(proto,"stss",4);
      if (iVar1 != 0) {
        gethostname(hostname,0x40);
        fprintf(_stderr,"[%s] ",hostname);
        fwrite("Unknown application protocol\n",0x1d,1,_stderr);
        return (application_protocol *)0x0;
      }
      puVar3 = (undefined8 *)calloc(1,0x28);
      if (puVar3 == (undefined8 *)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                      ,0xe5,"int stss_init(char *, struct application_protocol *)");
      }
      hostname._0_8_ = proto;
      pcVar4 = strtok_r(proto,"_",(char **)hostname);
      iVar1 = strncmp(pcVar4,"stssr",5);
      if (iVar1 == 0) {
        *(undefined4 *)(puVar3 + 3) = 1;
      }
      else {
        iVar2 = strncmp(pcVar4,"stss",4);
        if (iVar2 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                        ,0xee,"int stss_init(char *, struct application_protocol *)");
        }
      }
      pcVar4 = strtok_r((char *)hostname._0_8_,"_",(char **)hostname);
      prVar6 = init_rand(pcVar4);
      *puVar3 = prVar6;
      if (prVar6 == (rand_gen *)0x0) {
        __assert_fail("data->time_gen",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                      ,0xf1,"int stss_init(char *, struct application_protocol *)");
      }
      pcVar4 = strtok_r((char *)hostname._0_8_,"_",(char **)hostname);
      prVar6 = init_rand(pcVar4);
      puVar3[1] = prVar6;
      if (prVar6 == (rand_gen *)0x0) {
        __assert_fail("data->req_size_gen",
                      "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                      ,0xf4,"int stss_init(char *, struct application_protocol *)");
      }
      pcVar4 = strtok_r((char *)hostname._0_8_,"_",(char **)hostname);
      prVar6 = init_rand(pcVar4);
      puVar3[2] = prVar6;
      if (prVar6 != (rand_gen *)0x0) {
        if (iVar1 == 0) {
          pcVar4 = strtok_r((char *)hostname._0_8_,"_",(char **)hostname);
          dVar7 = atof(pcVar4);
          puVar3[4] = dVar7;
        }
        app_proto->arg = puVar3;
        app_proto->create_request = stss_create_request;
        app_proto->consume_response = stss_consume_response;
        app_proto->type = PROTO_STSS;
        return app_proto;
      }
      __assert_fail("data->rep_size_gen",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                    ,0xf7,"int stss_init(char *, struct application_protocol *)");
    }
    strtok(proto,":");
    pcVar4 = strtok((char *)0x0,"");
    prVar6 = init_rand(pcVar4);
    if (prVar6 == (rand_gen *)0x0) {
      __assert_fail("gen",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                    ,0x89,"int synthetic_init(char *, struct application_protocol *)");
    }
    app_proto->type = PROTO_SYNTHETIC;
    app_proto->arg = prVar6;
    app_proto->create_request = synthetic_create_request;
    pcVar5 = synthetic_consume_response;
LAB_00107868:
    app_proto->consume_response = pcVar5;
    return app_proto;
  }
  strtok(proto,":");
  pcVar4 = strtok((char *)0x0,":");
  iVar1 = atoi(pcVar4);
  puVar3 = (undefined8 *)malloc(0x10);
  if (puVar3 == (undefined8 *)0x0) {
    pcVar4 = "arg";
    __line = 0x50;
  }
  else {
    __size = (size_t)iVar1;
    __s = malloc(__size);
    *puVar3 = __s;
    if (__s != (void *)0x0) {
      memset(__s,0x23,__size);
      puVar3[1] = __size;
      app_proto->type = PROTO_ECHO;
      app_proto->arg = puVar3;
      app_proto->create_request = echo_create_request;
      pcVar5 = echo_consume_response;
      goto LAB_00107868;
    }
    pcVar4 = "arg->iov_base";
    __line = 0x52;
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                ,__line,"int echo_init(char *, struct application_protocol *)");
}

Assistant:

struct application_protocol *init_app_proto(char *proto)
{
	struct application_protocol *app_proto;

	app_proto = malloc(sizeof(struct application_protocol));
	assert(app_proto);

	// Init random char
	memset(random_char, 'x', MAX_VAL_SIZE);

	if (strncmp(proto, "echo", 4) == 0)
		echo_init(proto, app_proto);
	else if (strncmp(proto, "synthetic", 9) == 0)
		synthetic_init(proto, app_proto);
	else if (strncmp(proto, "redis", 5) == 0)
		redis_init(proto, app_proto);
	else if (strncmp(proto, "memcache", 8) == 0)
		memcache_init(proto, app_proto);
	else if (strncmp(proto, "http", 4) == 0) {
		int i = http_proto_init(proto, app_proto);
		if (i != 0)
			return NULL;
	} else if (strncmp(proto, "stss", 4) == 0)
		stss_init(proto, app_proto);
	else {
		lancet_fprintf(stderr, "Unknown application protocol\n");
		return NULL;
	}

	return app_proto;
}